

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIComboBox * __thiscall
irr::gui::CGUIEnvironment::addComboBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  CGUIComboBox *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUIComboBox *)operator_new(0x1b0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIComboBox::CGUIComboBox(this_00,&this->super_IGUIEnvironment,parent_00,id,*rectangle);
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUIComboBox *)this_00;
}

Assistant:

IGUIComboBox *CGUIEnvironment::addComboBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id)
{
	IGUIComboBox *t = new CGUIComboBox(this, parent ? parent : this,
			id, rectangle);
	t->drop();
	return t;
}